

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSearchBasedMethod.cpp
# Opt level: O0

Type __thiscall
QuantLib::LineSearchBasedMethod::minimize
          (LineSearchBasedMethod *this,Problem *P,EndCriteria *endCriteria,RealType initialStepSize)

{
  bool bVar1;
  DynamicVector<double,_std::allocator<double>_> *v2;
  EndCriteria *in_RDX;
  Problem *in_RSI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  RealType RVar2;
  double dVar3;
  double dVar4;
  bool first_time;
  DynamicVector<double,_std::allocator<double>_> direction;
  DynamicVector<double,_std::allocator<double>_> sddiff;
  DynamicVector<double,_std::allocator<double>_> d;
  DynamicVector<double,_std::allocator<double>_> prevGradient;
  size_t sz;
  RealType t;
  RealType fdiff;
  RealType gold2;
  RealType fold;
  RealType fnew;
  bool done;
  size_t iterationNumber_;
  DynamicVector<double,_std::allocator<double>_> x_;
  Type ecType;
  size_t maxStationaryStateIterations_;
  RealType ftol;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  Problem *in_stack_fffffffffffffd40;
  DynamicVector<double,_std::allocator<double>_> *in_stack_fffffffffffffd48;
  Problem *in_stack_fffffffffffffd50;
  DynamicVector<double,_std::allocator<double>_> *in_stack_fffffffffffffd58;
  Problem *pPVar5;
  undefined1 local_178 [31];
  byte local_159;
  undefined1 local_d8 [24];
  size_type local_c0;
  undefined8 local_b8;
  double local_b0;
  RealType local_a8;
  RealType local_a0;
  RealType local_98;
  byte local_8d;
  size_t local_60;
  Type local_3c;
  size_t local_38;
  RealType local_30;
  undefined8 local_28;
  EndCriteria *local_20;
  Problem *local_18;
  Type local_4;
  
  local_28 = in_XMM0_Qa;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = EndCriteria::functionEpsilon(in_RDX);
  local_38 = EndCriteria::maxStationaryStateIterations(local_20);
  local_3c = None;
  Problem::reset(local_18);
  Problem::currentValue(local_18);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40,
             (DynamicVector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
  local_60 = 0;
  OpenMD::DynamicVector<double,_std::allocator<double>_>::size
            ((DynamicVector<double,_std::allocator<double>_> *)0x26a409);
  std::allocator<double>::allocator((allocator<double> *)0x26a426);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40,
             CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
             (allocator_type *)0x26a443);
  LineSearch::searchDirection((LineSearch *)in_RDI[1]);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::operator=
            ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40,
             (DynamicVector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x26a48a);
  std::allocator<double>::~allocator((allocator<double> *)0x26a497);
  local_8d = 0;
  local_b8 = local_28;
  LineSearch::searchDirection((LineSearch *)in_RDI[1]);
  local_c0 = OpenMD::DynamicVector<double,_std::allocator<double>_>::size
                       ((DynamicVector<double,_std::allocator<double>_> *)0x26a4d9);
  std::allocator<double>::allocator((allocator<double> *)0x26a506);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40,
             CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
             (allocator_type *)0x26a523);
  std::allocator<double>::~allocator((allocator<double> *)0x26a532);
  std::allocator<double>::allocator((allocator<double> *)0x26a557);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40,
             CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
             (allocator_type *)0x26a574);
  std::allocator<double>::~allocator((allocator<double> *)0x26a583);
  std::allocator<double>::allocator((allocator<double> *)0x26a5a8);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40,
             CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
             (allocator_type *)0x26a5c5);
  std::allocator<double>::~allocator((allocator<double> *)0x26a5d4);
  std::allocator<double>::allocator((allocator<double> *)0x26a5f9);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40,
             CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
             (allocator_type *)0x26a616);
  std::allocator<double>::~allocator((allocator<double> *)0x26a625);
  pPVar5 = local_18;
  RVar2 = Problem::valueAndGradient
                    (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                     (DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40);
  Problem::setFunctionValue(pPVar5,RVar2);
  pPVar5 = local_18;
  RVar2 = Problem::DotProduct(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                              (DynamicVector<double,_std::allocator<double>_> *)
                              in_stack_fffffffffffffd40);
  Problem::setGradientNormValue(pPVar5,RVar2);
  OpenMD::operator-(in_stack_fffffffffffffd58);
  LineSearch::searchDirection((LineSearch *)in_RDI[1]);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::operator=
            ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40,
             (DynamicVector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x26a704);
  local_159 = 1;
  do {
    local_a0 = Problem::functionValue(local_18);
    local_a8 = Problem::gradientNormValue(local_18);
    if ((local_159 & 1) == 0) {
      LineSearch::lastGradient((LineSearch *)in_RDI[1]);
      OpenMD::DynamicVector<double,_std::allocator<double>_>::operator=
                ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40,
                 (DynamicVector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
    }
    local_b8 = (**(code **)(*(long *)in_RDI[1] + 0x10))
                         (local_b8,(long *)in_RDI[1],local_18,&local_3c,local_20);
    bVar1 = LineSearch::succeed((LineSearch *)in_RDI[1]);
    if (bVar1) {
      LineSearch::lastX((LineSearch *)in_RDI[1]);
      OpenMD::DynamicVector<double,_std::allocator<double>_>::operator=
                ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40,
                 (DynamicVector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
      Problem::setCurrentValue
                (in_stack_fffffffffffffd40,
                 (DynamicVector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
      pPVar5 = local_18;
      RVar2 = LineSearch::lastFunctionValue((LineSearch *)in_RDI[1]);
      Problem::setFunctionValue(pPVar5,RVar2);
      pPVar5 = local_18;
      RVar2 = LineSearch::lastGradientNorm2((LineSearch *)in_RDI[1]);
      Problem::setGradientNormValue(pPVar5,RVar2);
      (**(code **)(*in_RDI + 0x18))(local_a8,local_178,in_RDI,local_18,local_d8);
      OpenMD::DynamicVector<double,_std::allocator<double>_>::operator=
                ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40,
                 (DynamicVector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
      OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
                ((DynamicVector<double,_std::allocator<double>_> *)0x26aa54);
      v2 = LineSearch::searchDirection((LineSearch *)in_RDI[1]);
      OpenMD::operator-((DynamicVector<double,_std::allocator<double>_> *)pPVar5,v2);
      OpenMD::DynamicVector<double,_std::allocator<double>_>::operator=
                ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40,
                 (DynamicVector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
      OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
                ((DynamicVector<double,_std::allocator<double>_> *)0x26aaac);
      LineSearch::searchDirection((LineSearch *)in_RDI[1]);
      OpenMD::DynamicVector<double,_std::allocator<double>_>::operator=
                ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd40,
                 (DynamicVector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
      local_98 = Problem::functionValue(local_18);
      dVar3 = ABS(local_98 - local_a0) * 2.0;
      in_stack_fffffffffffffd40 = (Problem *)(ABS(local_98) + ABS(local_a0));
      dVar4 = std::numeric_limits<double>::epsilon();
      local_b0 = dVar3 / ((double)in_stack_fffffffffffffd40 + dVar4);
      if (local_30 <= local_b0) {
        in_stack_fffffffffffffd3f = EndCriteria::checkMaxIterations(local_20,local_60,&local_3c);
        if (!(bool)in_stack_fffffffffffffd3f) {
          Problem::setCurrentValue
                    (in_stack_fffffffffffffd40,
                     (DynamicVector<double,_std::allocator<double>_> *)
                     CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
          local_60 = local_60 + 1;
          local_159 = 0;
          goto LAB_0026ac66;
        }
      }
      EndCriteria::checkStationaryFunctionValue(local_20,0.0,0.0,&local_38,&local_3c);
      EndCriteria::checkMaxIterations(local_20,local_60,&local_3c);
      goto LAB_0026aca9;
    }
    local_8d = 1;
LAB_0026ac66:
  } while (((local_8d ^ 0xff) & 1) != 0);
  Problem::setCurrentValue
            (in_stack_fffffffffffffd40,
             (DynamicVector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
LAB_0026aca9:
  local_4 = local_3c;
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x26acb6);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x26acc3);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x26acd0);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x26acdd);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x26acea);
  return local_4;
}

Assistant:

EndCriteria::Type LineSearchBasedMethod::minimize(
      Problem& P, const EndCriteria& endCriteria,
      RealType initialStepSize = 1.0) {
    // Initializations
    RealType ftol = endCriteria.functionEpsilon();
    size_t maxStationaryStateIterations_ =
        endCriteria.maxStationaryStateIterations();
    EndCriteria::Type ecType = EndCriteria::None;   // reset end criteria
    P.reset();                                      // reset problem
    DynamicVector<RealType> x_ = P.currentValue();  // store the starting point
    size_t iterationNumber_    = 0;
    // dimension line search
    lineSearch_->searchDirection() = DynamicVector<RealType>(x_.size());
    bool done                      = false;

    // function and squared norm of gradient values;
    RealType fnew, fold, gold2;
    RealType fdiff;
    // classical initial value for line-search step
    // RealType t = 1.0;
    // new initial value for line-search step
    RealType t = initialStepSize;
    // Set gradient g at the size of the optimization problem
    // search direction
    size_t sz = lineSearch_->searchDirection().size();
    DynamicVector<RealType> prevGradient(sz), d(sz), sddiff(sz), direction(sz);
    // Initialize objective function, gradient prevGradient and
    // search direction

    P.setFunctionValue(P.valueAndGradient(prevGradient, x_));
    P.setGradientNormValue(P.DotProduct(prevGradient, prevGradient));
    lineSearch_->searchDirection() = -prevGradient;

    bool first_time = true;
    // Loop over iterations
    do {
      fold  = P.functionValue();
      gold2 = P.gradientNormValue();

      // Linesearch
      if (!first_time) prevGradient = lineSearch_->lastGradient();

      t = (*lineSearch_)(P, ecType, endCriteria, t);

      // don't throw: it can fail just because maxIterations exceeded
      // QL_REQUIRE(lineSearch_->succeed(), "line-search failed!");
      if (lineSearch_->succeed()) {
        // Updates
        // New point
        x_ = lineSearch_->lastX();
        P.setCurrentValue(x_);
        // New function value
        P.setFunctionValue(lineSearch_->lastFunctionValue());
        // New gradient and search direction vectors

        // orthogonalization coef
        P.setGradientNormValue(lineSearch_->lastGradientNorm2());

        // conjugate gradient search direction
        direction = getUpdatedDirection(P, gold2, prevGradient);

        sddiff = direction - lineSearch_->searchDirection();

        lineSearch_->searchDirection() = direction;
        // Now compute accuracy and check end criteria
        // Numerical Recipes exit strategy on fx (see NR in C++, p.423)

        fnew  = P.functionValue();
        fdiff = 2.0 * std::fabs(fnew - fold) /
                (std::fabs(fnew) + std::fabs(fold) +
                 std::numeric_limits<RealType>::epsilon());

        if (fdiff < ftol ||
            endCriteria.checkMaxIterations(iterationNumber_, ecType)) {
          endCriteria.checkStationaryFunctionValue(
              0.0, 0.0, maxStationaryStateIterations_, ecType);
          endCriteria.checkMaxIterations(iterationNumber_, ecType);
          return ecType;
        }
        P.setCurrentValue(x_);  // update problem current value
        ++iterationNumber_;     // Increase iteration number
        first_time = false;
      } else {
        done = true;
      }
    } while (!done);
    P.setCurrentValue(x_);
    return ecType;
  }